

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

Variable * __thiscall cppgenerate::Variable::operator=(Variable *this,Variable *other)

{
  if (this != other) {
    std::__cxx11::string::_M_assign((string *)&this->m_initializer);
    std::__cxx11::string::_M_assign((string *)&this->m_type);
    std::__cxx11::string::_M_assign((string *)&this->m_name);
  }
  return this;
}

Assistant:

Variable& Variable::operator=( const Variable& other ){
    if( this != &other ){
        m_initializer = other.m_initializer;
        m_type = other.m_type;
        m_name = other.m_name;
    }
    return *this;
}